

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::PostDepthShaderCase::iterate(PostDepthShaderCase *this)

{
  deUint64 *__return_storage_ptr__;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  ShaderInfo *pSVar6;
  ProgramInfo *pPVar7;
  MessageBuilder local_cb8;
  undefined1 local_b38 [8];
  ShaderProgram program4;
  ProgramSources sources4;
  undefined1 local_818 [8];
  ShaderProgram program3;
  ProgramSources sources3;
  undefined1 local_4f8 [8];
  ShaderProgram program2;
  ProgramSources sources2;
  MessageBuilder local_350;
  undefined1 local_1c0 [8];
  ShaderProgram program1;
  ProgramSources sources1;
  Functions *gl;
  PostDepthShaderCase *this_local;
  Functions *gl_00;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  __return_storage_ptr__ = &program1.m_program.m_info.linkTimeUs;
  glu::makeVtxFragSources
            ((ProgramSources *)__return_storage_ptr__,&this->m_vertShader,&this->m_fragShader1);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_1c0,gl_00,(ProgramSources *)__return_storage_ptr__);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_1c0);
  if (bVar1) {
    glu::makeVtxFragSources
              ((ProgramSources *)&program2.m_program.m_info.linkTimeUs,&this->m_vertShader,
               &this->m_fragShader2);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)local_4f8,gl_00,
               (ProgramSources *)&program2.m_program.m_info.linkTimeUs);
    bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_4f8);
    if (bVar1) {
      glu::makeVtxFragSources
                ((ProgramSources *)&program3.m_program.m_info.linkTimeUs,&this->m_vertShader,
                 &this->m_fragShader3);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_818,gl_00,
                 (ProgramSources *)&program3.m_program.m_info.linkTimeUs);
      bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_818);
      if (bVar1) {
        glu::makeVtxFragSources
                  ((ProgramSources *)&program4.m_program.m_info.linkTimeUs,&this->m_vertShader,
                   &this->m_fragShader4);
        glu::ShaderProgram::ShaderProgram
                  ((ShaderProgram *)local_b38,gl_00,
                   (ProgramSources *)&program4.m_program.m_info.linkTimeUs);
        bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_b38);
        if (bVar1) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail checking second layout setup in shader");
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_cb8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<(&local_cb8,(char (*) [9])0x2a44bf9);
          pSVar6 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_b38,SHADERTYPE_VERTEX,0)
          ;
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])"Fragment: ");
          pSVar6 = glu::ShaderProgram::getShaderInfo
                             ((ShaderProgram *)local_b38,SHADERTYPE_FRAGMENT,0);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])"Program: ");
          pPVar7 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_b38);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pPVar7->infoLog);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_cb8);
        }
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_b38);
        glu::ProgramSources::~ProgramSources
                  ((ProgramSources *)&program4.m_program.m_info.linkTimeUs);
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail checking first layout setup in shader");
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&sources4.separable,pTVar4,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&sources4.separable,(char (*) [9])0x2a44bf9);
        pSVar6 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_818,SHADERTYPE_VERTEX,0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])"Fragment: ");
        pSVar6 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_818,SHADERTYPE_FRAGMENT,0)
        ;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])"Program: ");
        pPVar7 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_818);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pPVar7->infoLog);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&sources4.separable);
      }
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_818);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&program3.m_program.m_info.linkTimeUs);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail checking preprocessor directives in shader");
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&sources3.separable,pTVar4,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&sources3.separable,(char (*) [9])0x2a44bf9);
      pSVar6 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_4f8,SHADERTYPE_VERTEX,0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])"Fragment: ");
      pSVar6 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_4f8,SHADERTYPE_FRAGMENT,0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])"Program: ");
      pPVar7 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_4f8);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pPVar7->infoLog);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&sources3.separable);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4f8);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&program2.m_program.m_info.linkTimeUs);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail checking extension in shader");
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_350,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [9])0x2a44bf9);
    pSVar6 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_1c0,SHADERTYPE_VERTEX,0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])"Fragment: ");
    pSVar6 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_1c0,SHADERTYPE_FRAGMENT,0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pSVar6->infoLog);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])"Program: ");
    pPVar7 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_1c0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pPVar7->infoLog);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1c0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program1.m_program.m_info.linkTimeUs);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult PostDepthShaderCase::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	ProgramSources sources1 = makeVtxFragSources(m_vertShader, m_fragShader1);
	ShaderProgram  program1(gl, sources1);

	if (!program1.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking extension in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program1.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program1.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1.getProgramInfo().infoLog << tcu::TestLog::EndMessage;

		return STOP;
	}

	ProgramSources sources2 = makeVtxFragSources(m_vertShader, m_fragShader2);
	ShaderProgram  program2(gl, sources2);

	if (!program2.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking preprocessor directives in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program2.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program2.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program2.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources3 = makeVtxFragSources(m_vertShader, m_fragShader3);
	ShaderProgram  program3(gl, sources3);

	if (!program3.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking first layout setup in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program3.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program3.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program3.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources4 = makeVtxFragSources(m_vertShader, m_fragShader4);
	ShaderProgram  program4(gl, sources4);

	if (!program4.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking second layout setup in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program4.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program4.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program4.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}